

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
          (ExprComparator *this,
          BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
          e)

{
  bool bVar1;
  int *piVar2;
  
  piVar2 = (int *)0x0;
  if (**(int **)(this + 8) - 4U < 0x15) {
    piVar2 = *(int **)(this + 8);
  }
  bVar1 = mp::Equal((Expr)((ExprBase *)(piVar2 + 2))->impl_,
                    (Expr)((ExprBase *)
                          ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                 super_ExprBase.impl_ + 8))->impl_);
  return bVar1;
}

Assistant:

bool VisitUnary(E e) {
    return Equal(Cast<E>(expr_).arg(), e.arg());
  }